

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_counters.cpp
# Opt level: O3

int64_t __thiscall libtorrent::counters::operator[](counters *this,int i)

{
  return (this->m_stats_counter).super_array<std::atomic<long>,_291UL>._M_elems[i].
         super___atomic_base<long>._M_i;
}

Assistant:

std::int64_t counters::operator[](int i) const TORRENT_COUNTER_NOEXCEPT
	{
		TORRENT_ASSERT(i >= 0);
		TORRENT_ASSERT(i < num_counters);

#ifdef ATOMIC_LLONG_LOCK_FREE
		return m_stats_counter[i].load(std::memory_order_relaxed);
#else
		std::lock_guard<std::mutex> l(m_mutex);
		return m_stats_counter[i];
#endif
	}